

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

tmbstr get_option_names(CmdOptDesc *pos)

{
  size_t sVar1;
  char *__dest;
  undefined1 local_50 [8];
  CmdOptDesc localPos;
  uint len;
  tmbstr name;
  CmdOptDesc *pos_local;
  
  memcpy(local_50,pos,0x30);
  localize_option_names((CmdOptDesc *)local_50);
  sVar1 = strlen((char *)localPos._0_8_);
  localPos.name3._4_4_ = (int)sVar1;
  if (localPos.eqconfig != (ctmbstr)0x0) {
    sVar1 = strlen(localPos.eqconfig);
    localPos.name3._4_4_ = localPos.name3._4_4_ + (int)sVar1 + 2;
  }
  if (localPos.name2 != (ctmbstr)0x0) {
    sVar1 = strlen(localPos.name2);
    localPos.name3._4_4_ = localPos.name3._4_4_ + (int)sVar1 + 2;
  }
  __dest = (char *)malloc((ulong)(localPos.name3._4_4_ + 1));
  if (__dest == (char *)0x0) {
    outOfMemory();
  }
  strcpy(__dest,(char *)localPos._0_8_);
  free((void *)localPos._0_8_);
  if (localPos.eqconfig != (ctmbstr)0x0) {
    strcat(__dest,", ");
    strcat(__dest,localPos.eqconfig);
    free(localPos.eqconfig);
  }
  if (localPos.name2 != (ctmbstr)0x0) {
    strcat(__dest,", ");
    strcat(__dest,localPos.name2);
    free(localPos.name2);
  }
  return __dest;
}

Assistant:

static tmbstr get_option_names( const CmdOptDesc* pos )
{
    tmbstr name;
    uint len;
    CmdOptDesc localPos = *pos;

    localize_option_names( &localPos );

    len = strlen(localPos.name1);
    if (localPos.name2)
        len += 2+strlen(localPos.name2);
    if (localPos.name3)
        len += 2+strlen(localPos.name3);

    name = (tmbstr)malloc(len+1);
    if (!name) outOfMemory();
    strcpy(name, localPos.name1);
    free((tmbstr)localPos.name1);
    if (localPos.name2)
    {
        strcat(name, ", ");
        strcat(name, localPos.name2);
        free((tmbstr)localPos.name2);
    }
    if (localPos.name3)
    {
        strcat(name, ", ");
        strcat(name, localPos.name3);
        free((tmbstr)localPos.name3);
    }
    return name;
}